

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewRandomAccessFile
          (PosixEnv *this,string *filename,RandomAccessFile **result)

{
  int iVar1;
  _func_int **pp_Var2;
  int __fd;
  void *pvVar3;
  undefined8 *puVar4;
  int *piVar5;
  int *piVar6;
  int iVar7;
  undefined8 *in_RCX;
  uint64_t file_size;
  _func_int **local_80;
  size_t local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  *in_RCX = 0;
  __fd = open((char *)*result,0x80000);
  if (__fd < 0) {
    piVar5 = __errno_location();
    PosixError((anon_unknown_1 *)this,(string *)result,*piVar5);
  }
  else {
    piVar5 = (int *)((long)&filename[8].field_2 + 8);
    LOCK();
    piVar6 = (int *)((long)&filename[8].field_2 + 8);
    iVar1 = *piVar6;
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (iVar1 < 1) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
      puVar4 = (undefined8 *)operator_new(0x38);
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,*result,
                 (long)&(*result)->_vptr_RandomAccessFile + (long)&result[1]->_vptr_RandomAccessFile
                );
      *puVar4 = &PTR__PosixRandomAccessFile_0010d928;
      LOCK();
      piVar5 = (int *)((long)&filename[8].field_2 + 0xc);
      iVar1 = *piVar5;
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      piVar5 = (int *)((long)&filename[8].field_2 + 0xc);
      iVar7 = __fd;
      if (iVar1 < 1) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
        iVar7 = -1;
      }
      *(bool *)(puVar4 + 1) = 0 < iVar1;
      *(int *)((long)puVar4 + 0xc) = iVar7;
      puVar4[2] = piVar5;
      puVar4[3] = puVar4 + 5;
      if (local_70 == &local_60) {
        puVar4[5] = CONCAT71(uStack_5f,local_60);
        puVar4[6] = uStack_58;
      }
      else {
        puVar4[3] = local_70;
        puVar4[5] = CONCAT71(uStack_5f,local_60);
      }
      puVar4[4] = local_68;
      local_68 = 0;
      local_60 = 0;
      local_70 = &local_60;
      if (*(char *)(puVar4 + 1) == '\0') {
        if (*(int *)((long)puVar4 + 0xc) != -1) {
          __assert_fail("fd_ == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_posix.cc"
                        ,0x9e,
                        "leveldb::(anonymous namespace)::PosixRandomAccessFile::PosixRandomAccessFile(std::string, int, Limiter *)"
                       );
        }
        close(__fd);
      }
      *in_RCX = puVar4;
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      (this->super_Env)._vptr_Env = (_func_int **)0x0;
    }
    else {
      (**(code **)((filename->_M_dataplus)._M_p + 0x58))(this,filename,result,&local_78);
      if ((this->super_Env)._vptr_Env == (_func_int **)0x0) {
        pvVar3 = mmap((void *)0x0,local_78,1,1,__fd,0);
        if (pvVar3 == (void *)0xffffffffffffffff) {
          piVar6 = __errno_location();
          PosixError((anon_unknown_1 *)&local_80,(string *)result,*piVar6);
          pp_Var2 = (this->super_Env)._vptr_Env;
          (this->super_Env)._vptr_Env = local_80;
          local_80 = pp_Var2;
          if (pp_Var2 != (_func_int **)0x0) {
            operator_delete__(pp_Var2);
          }
        }
        else {
          puVar4 = (undefined8 *)operator_new(0x40);
          local_50 = &local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,*result,
                     (long)&(*result)->_vptr_RandomAccessFile +
                     (long)&result[1]->_vptr_RandomAccessFile);
          *puVar4 = &PTR__PosixMmapReadableFile_0010d968;
          puVar4[1] = pvVar3;
          puVar4[2] = local_78;
          puVar4[3] = piVar5;
          puVar4[4] = puVar4 + 6;
          if (local_50 == &local_40) {
            puVar4[6] = CONCAT71(uStack_3f,local_40);
            puVar4[7] = uStack_38;
          }
          else {
            puVar4[4] = local_50;
            puVar4[6] = CONCAT71(uStack_3f,local_40);
          }
          puVar4[5] = local_48;
          local_48 = 0;
          local_40 = 0;
          *in_RCX = puVar4;
          local_50 = &local_40;
        }
      }
      close(__fd);
      if ((this->super_Env)._vptr_Env != (_func_int **)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status NewRandomAccessFile(const std::string& filename,
                             RandomAccessFile** result) override {
    *result = nullptr;
    int fd = ::open(filename.c_str(), O_RDONLY | kOpenBaseFlags);
    if (fd < 0) {
      return PosixError(filename, errno);
    }

    if (!mmap_limiter_.Acquire()) {
      *result = new PosixRandomAccessFile(filename, fd, &fd_limiter_);
      return Status::OK();
    }

    uint64_t file_size;
    Status status = GetFileSize(filename, &file_size);
    if (status.ok()) {
      void* mmap_base =
          ::mmap(/*addr=*/nullptr, file_size, PROT_READ, MAP_SHARED, fd, 0);
      if (mmap_base != MAP_FAILED) {
        *result = new PosixMmapReadableFile(filename,
                                            reinterpret_cast<char*>(mmap_base),
                                            file_size, &mmap_limiter_);
      } else {
        status = PosixError(filename, errno);
      }
    }
    ::close(fd);
    if (!status.ok()) {
      mmap_limiter_.Release();
    }
    return status;
  }